

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QPersistentModelIndex,_QHashDummyValue>::findImpl<QPersistentModelIndex>
          (QHash<QPersistentModelIndex,_QHashDummyValue> *this,QPersistentModelIndex *key)

{
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_00;
  Data *pDVar1;
  Data *pDVar2;
  Bucket BVar3;
  iterator iVar4;
  
  this_00 = this->d;
  if ((this_00 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) ||
     (this_00->size == 0)) {
    pDVar1 = (Data *)0x0;
    pDVar2 = (Data *)0x0;
  }
  else {
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
            findBucket<QPersistentModelIndex>(this_00,key);
    pDVar2 = (Data *)(((long)BVar3.span - (long)this->d->spans) / 0x90 << 7 | BVar3.index);
    detach(this);
    pDVar1 = this->d;
    if (this->d->spans[(ulong)pDVar2 >> 7].offsets[(uint)BVar3.index & 0x7f] == 0xff) {
      pDVar1 = (Data *)0x0;
      pDVar2 = (Data *)0x0;
    }
  }
  iVar4.i.bucket = (size_t)pDVar2;
  iVar4.i.d = pDVar1;
  return (iterator)iVar4.i;
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }